

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypeParser.cpp
# Opt level: O3

void __thiscall OpenMD::InversionTypeParser::InversionTypeParser(InversionTypeParser *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type *pmVar3;
  key_type local_38;
  
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"AmberImproper","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_38);
  *pmVar3 = itAmberImproper;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ImproperCosine","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_38);
  *pmVar3 = itImproperCosine;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Harmonic","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_38);
  *pmVar3 = itHarmonic;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CentralAtomHeight","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_38);
  *pmVar3 = itCentralAtomHeight;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Dreiding","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
           ::operator[](&this->stringToEnumMap_,&local_38);
  *pmVar3 = itDreiding;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

InversionTypeParser::InversionTypeParser() {
    stringToEnumMap_["AmberImproper"]     = itAmberImproper;
    stringToEnumMap_["ImproperCosine"]    = itImproperCosine;
    stringToEnumMap_["Harmonic"]          = itHarmonic;
    stringToEnumMap_["CentralAtomHeight"] = itCentralAtomHeight;
    stringToEnumMap_["Dreiding"]          = itDreiding;
  }